

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowLeadLagGlobalState::~WindowLeadLagGlobalState(WindowLeadLagGlobalState *this)

{
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> _Var1;
  _Head_base<0UL,_duckdb::WindowIndexTree_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_WindowValueGlobalState).super_WindowExecutorGlobalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowLeadLagGlobalState_019d2880;
  _Var1._M_head_impl =
       (this->row_tree).
       super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
       .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (WindowTokenTree *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WindowMergeSortTree + 8))();
  }
  (this->row_tree).
  super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>.
  super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = (WindowTokenTree *)0x0;
  (this->super_WindowValueGlobalState).super_WindowExecutorGlobalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowValueGlobalState_019d2848;
  _Var2._M_head_impl =
       (this->super_WindowValueGlobalState).value_tree.
       super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
       .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (WindowIndexTree *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_WindowMergeSortTree + 8))();
  }
  (this->super_WindowValueGlobalState).value_tree.
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl = (WindowIndexTree *)0x0;
  this_00 = (this->super_WindowValueGlobalState).all_valid.
            super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_WindowValueGlobalState).super_WindowExecutorGlobalState.super_WindowExecutorState.
  _vptr_WindowExecutorState = (_func_int **)&PTR__WindowExecutorGlobalState_019d25e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->super_WindowValueGlobalState).super_WindowExecutorGlobalState.arg_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  operator_delete(this);
  return;
}

Assistant:

explicit WindowLeadLagGlobalState(const WindowValueExecutor &executor, const idx_t payload_count,
	                                  const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowValueGlobalState(executor, payload_count, partition_mask, order_mask) {

		if (value_tree) {
			use_framing = true;

			//	If the argument order is prefix of the partition ordering,
			//	then we can just use the partition ordering.
			auto &wexpr = executor.wexpr;
			auto &arg_orders = executor.wexpr.arg_orders;
			const auto optimize = ClientConfig::GetConfig(executor.context).enable_optimizer;
			if (!optimize || BoundWindowExpression::GetSharedOrders(wexpr.orders, arg_orders) != arg_orders.size()) {
				//	"The ROW_NUMBER function can be computed by disambiguating duplicate elements based on their
				//	position in the input data, such that two elements never compare as equal."
				// 	Note: If the user specifies an partial secondary sort, the disambiguation will use the
				//	partition's row numbers, not the secondary sort's row numbers.
				row_tree = make_uniq<WindowTokenTree>(executor.context, arg_orders, executor.arg_order_idx,
				                                      payload_count, true);
			} else {
				// The value_tree is cheap to construct, so we just get rid of it if we now discover we don't need it.
				value_tree.reset();
			}
		}
	}